

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void push_output(Context *ctx,Buffer **section)

{
  long lVar1;
  Buffer *pBVar2;
  
  lVar1 = (long)ctx->output_stack_len;
  if (2 < lVar1) {
    __assert_fail("ctx->output_stack_len < (int) (STATICARRAYLEN(ctx->output_stack))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x168,"void push_output(Context *, Buffer **)");
  }
  ctx->output_stack[lVar1] = ctx->output;
  ctx->indent_stack[lVar1] = ctx->indent;
  ctx->output_stack_len = ctx->output_stack_len + 1;
  pBVar2 = *section;
  if (pBVar2 == (Buffer *)0x0) {
    pBVar2 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
    *section = pBVar2;
    if (pBVar2 == (Buffer *)0x0) {
      return;
    }
  }
  ctx->output = pBVar2;
  ctx->indent = 0;
  return;
}

Assistant:

static void push_output(Context *ctx, Buffer **section)
{
    assert(ctx->output_stack_len < (int) (STATICARRAYLEN(ctx->output_stack)));
    ctx->output_stack[ctx->output_stack_len] = ctx->output;
    ctx->indent_stack[ctx->output_stack_len] = ctx->indent;
    ctx->output_stack_len++;
    if (!set_output(ctx, section))
        return;
    ctx->indent = 0;
}